

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::PixelFilter
          (FormattingScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  float __x;
  undefined1 auVar1 [16];
  bool bVar2;
  ostream *poVar3;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  float *in_R8;
  string sStack_198;
  string local_178;
  vector<float,_std::allocator<float>_> alpha;
  vector<float,_std::allocator<float>_> yr;
  vector<float,_std::allocator<float>_> xr;
  float local_10c;
  string extra;
  ParameterDictionary dict;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_80;
  
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_80,in_RDX);
  ParameterDictionary::ParameterDictionary(&dict,&local_80,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_80);
  extra._M_dataplus._M_p = (pointer)&extra.field_2;
  extra._M_string_length = 0;
  extra.field_2._M_local_buf[0] = '\0';
  if (this->upgrade == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_198,"xwidth",(allocator<char> *)&local_178);
    ParameterDictionary::GetFloatArray(&xr,&dict,&sStack_198);
    std::__cxx11::string::~string((string *)&sStack_198);
    if ((long)xr.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)xr.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start == 4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_198,"xwidth",(allocator<char> *)&local_178);
      ParameterDictionary::RemoveFloat(&dict,&sStack_198);
      std::__cxx11::string::~string((string *)&sStack_198);
      indent_abi_cxx11_(&local_178,this,1);
      StringPrintf<std::__cxx11::string,float&>
                (&sStack_198,(pbrt *)"%s\"float xradius\" [ %f ]\n",(char *)&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 xr.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,in_R8);
      std::__cxx11::string::append((string *)&extra);
      std::__cxx11::string::~string((string *)&sStack_198);
      std::__cxx11::string::~string((string *)&local_178);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_198,"ywidth",(allocator<char> *)&local_178);
    ParameterDictionary::GetFloatArray(&yr,&dict,&sStack_198);
    std::__cxx11::string::~string((string *)&sStack_198);
    if ((long)yr.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)yr.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start == 4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_198,"ywidth",(allocator<char> *)&local_178);
      ParameterDictionary::RemoveFloat(&dict,&sStack_198);
      std::__cxx11::string::~string((string *)&sStack_198);
      indent_abi_cxx11_(&local_178,this,1);
      StringPrintf<std::__cxx11::string,float&>
                (&sStack_198,(pbrt *)"%s\"float yradius\" [ %f ]\n",(char *)&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 yr.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,in_R8);
      std::__cxx11::string::append((string *)&extra);
      std::__cxx11::string::~string((string *)&sStack_198);
      std::__cxx11::string::~string((string *)&local_178);
    }
    bVar2 = std::operator==(name,"gaussian");
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_198,"alpha",(allocator<char> *)&local_178);
      ParameterDictionary::GetFloatArray(&alpha,&dict,&sStack_198);
      std::__cxx11::string::~string((string *)&sStack_198);
      if ((long)alpha.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)alpha.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start == 4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sStack_198,"alpha",(allocator<char> *)&local_178);
        ParameterDictionary::RemoveFloat(&dict,&sStack_198);
        std::__cxx11::string::~string((string *)&sStack_198);
        indent_abi_cxx11_(&local_178,this,1);
        __x = *alpha.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start +
              *alpha.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
        if (__x < 0.0) {
          local_10c = sqrtf(__x);
        }
        else {
          auVar1 = vsqrtss_avx(ZEXT416((uint)__x),ZEXT416((uint)__x));
          local_10c = auVar1._0_4_;
        }
        local_10c = 1.0 / local_10c;
        StringPrintf<std::__cxx11::string,float>
                  (&sStack_198,(pbrt *)"%s\"float sigma\" [ %f ]\n",(char *)&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_10c,
                   in_R8);
        std::__cxx11::string::append((string *)&extra);
        std::__cxx11::string::~string((string *)&sStack_198);
        std::__cxx11::string::~string((string *)&local_178);
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&alpha.super__Vector_base<float,_std::allocator<float>_>);
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&yr.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&xr.super__Vector_base<float,_std::allocator<float>_>);
  }
  indent_abi_cxx11_(&sStack_198,this,0);
  Printf<std::__cxx11::string,std::__cxx11::string_const&>
            ("%sPixelFilter \"%s\"\n",&sStack_198,name);
  std::__cxx11::string::~string((string *)&sStack_198);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&extra);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&sStack_198,&dict,*(int *)&(this->super_SceneRepresentation).field_0xc);
  std::operator<<(poVar3,(string *)&sStack_198);
  std::__cxx11::string::~string((string *)&sStack_198);
  std::__cxx11::string::~string((string *)&extra);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&dict.params);
  return;
}

Assistant:

void FormattingScene::PixelFilter(const std::string &name, ParsedParameterVector params,
                                  FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    std::string extra;
    if (upgrade) {
        std::vector<Float> xr = dict.GetFloatArray("xwidth");
        if (xr.size() == 1) {
            dict.RemoveFloat("xwidth");
            extra += StringPrintf("%s\"float xradius\" [ %f ]\n", indent(1), xr[0]);
        }
        std::vector<Float> yr = dict.GetFloatArray("ywidth");
        if (yr.size() == 1) {
            dict.RemoveFloat("ywidth");
            extra += StringPrintf("%s\"float yradius\" [ %f ]\n", indent(1), yr[0]);
        }

        if (name == "gaussian") {
            std::vector<Float> alpha = dict.GetFloatArray("alpha");
            if (alpha.size() == 1) {
                dict.RemoveFloat("alpha");
                extra += StringPrintf("%s\"float sigma\" [ %f ]\n", indent(1),
                                      1 / std::sqrt(2 * alpha[0]));
            }
        }
    }

    Printf("%sPixelFilter \"%s\"\n", indent(), name);
    std::cout << extra << dict.ToParameterList(catIndentCount);
}